

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::ByteSizeLong(GLMRegressor_DoubleArray *this)

{
  uint uVar1;
  int iVar2;
  size_t size;
  size_t sVar3;
  int cached_size;
  int cached_size_1;
  size_t data_size;
  long lStack_18;
  uint count;
  size_t total_size;
  GLMRegressor_DoubleArray *this_local;
  
  lStack_18 = 0;
  uVar1 = value_size(this);
  size = (ulong)uVar1 * 8;
  if ((ulong)uVar1 != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::Int32Size((int32)size);
    lStack_18 = sVar3 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(size);
  this->_value_cached_byte_size_ = iVar2;
  iVar2 = google::protobuf::internal::ToCachedSize(size + lStack_18);
  this->_cached_size_ = iVar2;
  return size + lStack_18;
}

Assistant:

size_t GLMRegressor_DoubleArray::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.GLMRegressor.DoubleArray)
  size_t total_size = 0;

  // repeated double value = 1;
  {
    unsigned int count = this->value_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _value_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}